

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O0

string * __thiscall
flatbuffers::TypedFloatConstantGenerator::MakeInf
          (string *__return_storage_ptr__,TypedFloatConstantGenerator *this,bool neg,string *prefix)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *prefix_local;
  TypedFloatConstantGenerator *pTStack_18;
  bool neg_local;
  TypedFloatConstantGenerator *this_local;
  
  local_28 = prefix;
  prefix_local._7_1_ = neg;
  pTStack_18 = this;
  this_local = (TypedFloatConstantGenerator *)__return_storage_ptr__;
  if (neg) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::operator+(__return_storage_ptr__,local_28,&this->neg_inf_number_);
    }
    else {
      std::operator+(&local_48,"-",local_28);
      std::operator+(__return_storage_ptr__,&local_48,&this->pos_inf_number_);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  else {
    std::operator+(__return_storage_ptr__,prefix,&this->pos_inf_number_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypedFloatConstantGenerator::MakeInf(
    bool neg, const std::string &prefix) const {
  if (neg)
    return !neg_inf_number_.empty() ? (prefix + neg_inf_number_)
                                    : ("-" + prefix + pos_inf_number_);
  else
    return prefix + pos_inf_number_;
}